

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finitediff.cpp
# Opt level: O2

MatrixXd *
fd::unflatten(MatrixXd *__return_storage_ptr__,
             Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *x,int dim
             )

{
  PointerType pdVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  int i;
  ulong uVar6;
  long local_30;
  int local_24 [2];
  int dim_local;
  
  local_30 = (x->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
             .m_rows.m_value / (long)dim;
  local_24[0] = dim;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_30,local_24);
  pdVar1 = (x->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data;
  lVar2 = (x->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  pdVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_data;
  lVar4 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows;
  for (uVar6 = 0; (long)uVar6 < lVar2; uVar6 = uVar6 + 1) {
    uVar5 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
    pdVar3[((long)uVar5 % (long)local_24[0] & 0xffffffffU) * lVar4 +
           (long)(int)((long)uVar5 / (long)local_24[0])] = pdVar1[uVar6];
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd unflatten(const Eigen::Ref<const Eigen::VectorXd>& x, int dim)
{
    assert(x.size() % dim == 0);
    Eigen::MatrixXd X(x.size() / dim, dim);
    for (int i = 0; i < x.size(); i++) {
        X(i / dim, i % dim) = x(i);
    }
    return X;
}